

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

void adiak_register_cb(int adiak_version,int category,adiak_nameval_cb_t nv,int report_on_all_ranks,
                      void *opaque_val)

{
  adiak_tool_t *paVar1;
  adiak_tool_t **ppaVar2;
  adiak_tool_t *paVar3;
  
  adiak_common_init();
  paVar3 = (adiak_tool_t *)calloc(1,0x30);
  paVar3->version = adiak_version;
  paVar3->opaque_val = opaque_val;
  paVar3->report_on_all_ranks = report_on_all_ranks;
  paVar3->name_val_cb = nv;
  paVar3->category = category;
  ppaVar2 = tool_list;
  paVar1 = *tool_list;
  paVar3->next = paVar1;
  if (paVar1 != (adiak_tool_t *)0x0) {
    paVar1->prev = paVar3;
  }
  *ppaVar2 = paVar3;
  if ((report_on_all_ranks != 0) && (adiak_config->report_on_all_ranks == 0)) {
    adiak_config->report_on_all_ranks = 1;
  }
  return;
}

Assistant:

void adiak_register_cb(int adiak_version, int category,
                       adiak_nameval_cb_t nv, int report_on_all_ranks, void *opaque_val)
{
   adiak_register(adiak_version, category, nv, report_on_all_ranks, opaque_val);
}